

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  pointer pcVar6;
  bool bVar7;
  string local_60;
  ReusableStringStream local_40;
  SourceLineInfo local_28;
  
  switch(this->m_wildcard) {
  case NoWildcard:
    normaliseString(&local_60,this,str);
    uVar5 = (this->m_pattern)._M_string_length;
    if (uVar5 == local_60._M_string_length) {
      if (uVar5 != 0) {
        pcVar6 = (this->m_pattern)._M_dataplus._M_p;
LAB_0017391a:
        iVar3 = bcmp(pcVar6,local_60._M_dataplus._M_p,uVar5);
        bVar7 = iVar3 == 0;
        goto LAB_001739d2;
      }
LAB_001739f0:
      bVar7 = true;
      goto LAB_001739d2;
    }
    break;
  case WildcardAtStart:
    normaliseString(&local_60,this,str);
    uVar5 = (this->m_pattern)._M_string_length;
    if (uVar5 <= local_60._M_string_length) {
      bVar7 = uVar5 == 0;
      if (bVar7) goto LAB_001739d2;
      pcVar6 = (this->m_pattern)._M_dataplus._M_p;
      if (pcVar6[uVar5 - 1] == local_60._M_dataplus._M_p[local_60._M_string_length - 1]) {
        lVar4 = 0;
        do {
          bVar7 = 1 - uVar5 == lVar4;
          if (bVar7) goto LAB_001739d2;
          lVar2 = lVar4 + (uVar5 - 2);
          lVar1 = lVar4 + (local_60._M_string_length - 2);
          lVar4 = lVar4 + -1;
        } while (pcVar6[lVar2] == local_60._M_dataplus._M_p[lVar1]);
      }
    }
    break;
  case WildcardAtEnd:
    normaliseString(&local_60,this,str);
    uVar5 = (this->m_pattern)._M_string_length;
    if (uVar5 <= local_60._M_string_length) {
      if (uVar5 != 0) {
        pcVar6 = (this->m_pattern)._M_dataplus._M_p;
        goto LAB_0017391a;
      }
      goto LAB_001739f0;
    }
    break;
  case WildcardAtBothEnds:
    normaliseString(&local_60,this,str);
    lVar4 = std::__cxx11::string::find
                      ((char *)&local_60,(ulong)(this->m_pattern)._M_dataplus._M_p,0);
    bVar7 = lVar4 != -1;
    goto LAB_001739d2;
  default:
    ReusableStringStream::ReusableStringStream(&local_40);
    local_28.file =
         "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/catch.hpp";
    local_28.line = 0x3c44;
    operator<<(local_40.m_oss,&local_28);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(local_40.m_oss,"Unknown enum",0xc);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_60);
  }
  bVar7 = false;
LAB_001739d2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool WildcardPattern::matches( std::string const& str ) const {
        switch( m_wildcard ) {
            case NoWildcard:
                return m_pattern == normaliseString( str );
            case WildcardAtStart:
                return endsWith( normaliseString( str ), m_pattern );
            case WildcardAtEnd:
                return startsWith( normaliseString( str ), m_pattern );
            case WildcardAtBothEnds:
                return contains( normaliseString( str ), m_pattern );
            default:
                CATCH_INTERNAL_ERROR( "Unknown enum" );
        }
    }